

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O1

void __thiscall trng::yarn3s::backward(yarn3s *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = (this->P).a[2];
  if (iVar5 == 0) {
    iVar5 = (this->P).a[1];
    if (iVar5 != 0) {
      lVar6 = (long)(this->S).r[2] * (long)(this->P).a[0];
      auVar1 = SEXT816(lVar6) * ZEXT816(0x8000524d34eaf859);
      iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffadb3 - (int)lVar6) +
              (this->S).r[1];
      goto LAB_00205ff0;
    }
    iVar4 = (this->P).a[0];
    if (iVar4 == 0) {
      iVar5 = 0;
      goto LAB_00206027;
    }
    iVar5 = (this->S).r[2];
    iVar4 = int_math::modulo_inverse(iVar4,0x7fffadb3);
    lVar6 = (long)iVar4 * (long)iVar5;
    lVar7 = SUB168(SEXT816(lVar6) * SEXT816(-0x7fffadb2cb1507a7),8);
  }
  else {
    lVar6 = (long)(this->S).r[1] * (long)(this->P).a[0];
    auVar1 = SEXT816(lVar6) * ZEXT816(0x8000524d34eaf859);
    iVar2 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffadb3 - (int)lVar6) +
            (this->S).r[0];
    iVar3 = iVar2 + 0x7fffadb3;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    lVar6 = (long)(this->S).r[2] * (long)(this->P).a[1];
    auVar1 = SEXT816(lVar6) * ZEXT816(0x8000524d34eaf859);
    iVar3 = (((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffadb3 - (int)lVar6) +
            iVar3;
LAB_00205ff0:
    iVar2 = iVar3 + 0x7fffadb3;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = int_math::modulo_inverse(iVar5,0x7fffadb3);
    lVar6 = (long)iVar4 * (long)iVar2;
    lVar7 = SUB168(SEXT816(lVar6) * SEXT816(-0x7fffadb2cb1507a7),8);
  }
  iVar5 = (int)lVar6 +
          ((int)((ulong)(lVar7 + lVar6) >> 0x1e) - (int)(lVar7 + lVar6 >> 0x3f)) * -0x7fffadb3;
LAB_00206027:
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  (this->S).r[2] = iVar5;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::backward() {
    result_type t;
    if (P.a[2] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[2];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = t;
  }